

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O2

REF_STATUS
ref_egads_get_attribute(REF_GEOM ref_geom,REF_INT type,REF_INT id,char *name,char **value)

{
  *value = (char *)0x0;
  printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n","ref_egads_get_attribute");
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_egads_get_attribute(REF_GEOM ref_geom, REF_INT type,
                                           REF_INT id, const char *name,
                                           const char **value) {
#ifdef HAVE_EGADS
  ego object = NULL;
  int attribute_type, len;
  const int *ints;
  const double *reals;
  int egads_status;

  *value = NULL;

  switch (type) {
    case (REF_GEOM_NODE):
      if (NULL == ref_geom->nodes) return REF_INVALID;
      if (id < 1 || id > ref_geom->nnode) return REF_INVALID;
      object = ((ego *)(ref_geom->nodes))[id - 1];
      break;
    case (REF_GEOM_EDGE):
      if (NULL == ref_geom->edges) return REF_INVALID;
      if (id < 1 || id > ref_geom->nedge) return REF_INVALID;
      object = ((ego *)(ref_geom->edges))[id - 1];
      break;
    case (REF_GEOM_FACE):
      if (NULL == ref_geom->faces) return REF_INVALID;
      if (id < 1 || id > ref_geom->nface) return REF_INVALID;
      object = ((ego *)(ref_geom->faces))[id - 1];
      break;
    case (REF_GEOM_BODY):
      if (NULL == ref_geom->body) return REF_INVALID;
      object = (ego)(ref_geom->body);
      break;
    default:
      RSS(REF_FAILURE, "unknown type");
  }

  egads_status = EG_attributeRet(object, name, &attribute_type, &len, &ints,
                                 &reals, value);
  if (EGADS_NOTFOUND == egads_status) return REF_NOT_FOUND;
  REIS(EGADS_SUCCESS, egads_status, "get/return attribute");
  if (ATTRSTRING != attribute_type) return REF_NOT_FOUND;

  return REF_SUCCESS;
#else
  *value = NULL;
  printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
  SUPRESS_UNUSED_COMPILER_WARNING(id);
  SUPRESS_UNUSED_COMPILER_WARNING(name);
  return REF_NOT_FOUND;
#endif
}